

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileURL.cpp
# Opt level: O0

void __thiscall FileURL::SetURLFromString(FileURL *this,string *inURL)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  reference __lhs;
  ulong local_100;
  bool local_c1;
  string local_c0 [32];
  string local_a0 [32];
  long local_80;
  size_type findResult;
  string newComponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ulong local_20;
  size_type searchPosition;
  string *inURL_local;
  FileURL *this_local;
  
  searchPosition = (size_type)inURL;
  inURL_local = (string *)this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mPathComponents);
  this->mIsAbsolute = false;
  local_20 = 0;
  uVar2 = std::__cxx11::string::size();
  local_c1 = false;
  if (8 < uVar2) {
    std::__cxx11::string::substr((ulong)&local_40,searchPosition);
    local_c1 = std::operator==(&local_40,"file:///");
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (local_c1 != false) {
    this->mIsAbsolute = true;
    local_20 = 8;
  }
  std::__cxx11::string::string((string *)&findResult);
  do {
    uVar2 = local_20;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar2) {
      std::__cxx11::string::~string((string *)&findResult);
      return;
    }
    local_80 = std::__cxx11::string::find((char *)searchPosition,0x449406);
    if (local_80 == -1) {
      std::__cxx11::string::substr((ulong)local_a0,searchPosition);
      std::__cxx11::string::operator=((string *)&findResult,local_a0);
      std::__cxx11::string::~string(local_a0);
    }
    else {
      std::__cxx11::string::substr((ulong)local_c0,searchPosition);
      std::__cxx11::string::operator=((string *)&findResult,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &findResult,"..");
    if ((bVar1) &&
       (sVar4 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->mPathComponents), sVar4 != 0)) {
      __lhs = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back(&this->mPathComponents);
      bVar1 = std::operator!=(__lhs,"..");
      if (!bVar1) goto LAB_001bba57;
      PopPathComponent(this);
    }
    else {
LAB_001bba57:
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &findResult,".");
      if (bVar1) {
        PushPathComponent(this,(string *)&findResult);
      }
    }
    if (local_80 == -1) {
      local_100 = std::__cxx11::string::length();
    }
    else {
      local_100 = local_80 + 1;
    }
    local_20 = local_100;
  } while( true );
}

Assistant:

void FileURL::SetURLFromString(const string& inURL)
{
	// path is expected to be either file:/ / /<folder1>/<folder2>....
	// or <folder1>/<folder2>...
    
	mPathComponents.clear();
	mIsAbsolute = false;	 
    
	string::size_type searchPosition = 0;
    
	if(inURL.size() > 8 && (inURL.substr(0,8) == "file:///"))
	{
        mIsAbsolute = true;
		searchPosition = 8; 
	}
    
	string newComponent;
	while(searchPosition < inURL.length())
	{
		string::size_type findResult = inURL.find("/",searchPosition);
		if(findResult == inURL.npos)
			newComponent = inURL.substr(searchPosition,findResult);
		else
			newComponent = inURL.substr(searchPosition,findResult-searchPosition);
        
		// with .. i'm doing some calculation already of sparing interim folders.
		// as a result if there are still ..s they will be only at the beginning of the path
		if(newComponent == ".." && mPathComponents.size() > 0 && mPathComponents.back() != "..")
			PopPathComponent();
		else if(newComponent != ".")
			PushPathComponent(newComponent);
        
		searchPosition = (findResult == inURL.npos) ? inURL.length() : findResult+1;
	}
}